

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O2

void __thiscall ncnn::BinaryOp_x86_avx2::forward_inplace(BinaryOp_x86_avx2 *this)

{
  Option *in_RDX;
  Mat *in_RSI;
  
  forward_inplace((BinaryOp_x86_avx2 *)
                  ((long)&this->_vptr_BinaryOp_x86_avx2 + (long)this->_vptr_BinaryOp_x86_avx2[-0xb])
                  ,in_RSI,in_RDX);
  return;
}

Assistant:

int BinaryOp_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}